

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_format(jit_State *J,RecordFFData *rd,TRef hdr,int sbufx)

{
  IRRef1 IVar1;
  IRRef1 IVar2;
  TRef TVar3;
  TRef TVar4;
  SFormat k;
  GCobj *o;
  uint local_134;
  IRCallID local_120;
  IRCallID id;
  TRef trsf;
  TRef tra;
  SFormat sf;
  FormatState fs;
  GCstr *fmt;
  TRef trfmt;
  TRef tr;
  ptrdiff_t arg;
  int sbufx_local;
  TRef hdr_local;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  _trfmt = (long)sbufx;
  TVar3 = lj_ir_tostr(J,J->base[_trfmt]);
  fs._24_8_ = argv2str(J,rd->argv + _trfmt);
  TVar4 = lj_ir_kgc(J,(GCobj *)fs._24_8_,IRT_STR);
  (J->fold).ins.field_0.ot = 0x884;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
  lj_opt_fold(J);
  _tra = (uint8_t *)(fs._24_8_ + 0x18);
  fs.p = _tra + *(uint *)(fs._24_8_ + 0x14);
  fmt._4_4_ = hdr;
LAB_001ac604:
  k = lj_strfmt_parse((FormatState *)&tra);
  IVar1 = (IRRef1)fmt._4_4_;
  if (k == 0) {
    if (sbufx == 0) {
      (J->fold).ins.field_0.ot = 0x5784;
      (J->fold).ins.field_0.op1 = IVar1;
      (J->fold).ins.field_0.op2 = (IRRef1)hdr;
      TVar3 = lj_opt_fold(J);
      *J->base = TVar3;
    }
    else {
      (J->fold).ins.field_0.ot = 0x1200;
      (J->fold).ins.field_0.op1 = IVar1;
      (J->fold).ins.field_0.op2 = 0;
      lj_opt_fold(J);
    }
    return;
  }
  if (k == 2) {
    local_134 = 0;
  }
  else {
    local_134 = J->base[_trfmt + 1];
    _trfmt = _trfmt + 1;
  }
  TVar3 = lj_ir_kint(J,k);
  IVar2 = (IRRef1)local_134;
  switch(k & 0xf) {
  case 1:
  case 8:
  default:
    recff_nyi(J,rd);
    return;
  case 2:
    o = (GCobj *)lj_str_new(J->L,(char *)fs.e,(ulong)(uint)fs.str);
    TVar3 = lj_ir_kgc(J,o,IRT_STR);
    (J->fold).ins.field_0.ot = 0x5689;
    (J->fold).ins.field_0.op1 = IVar1;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
    fmt._4_4_ = lj_opt_fold(J);
    goto LAB_001ac604;
  case 3:
    local_120 = IRCALL_lj_strfmt_putfnum_int;
    break;
  case 4:
    local_120 = IRCALL_lj_strfmt_putfnum_uint;
    break;
  case 5:
    local_120 = IRCALL_lj_strfmt_putfnum;
    goto LAB_001ac9a0;
  case 6:
    if ((local_134 & 0x1f000000) != 0x4000000) {
      recff_nyi(J,rd);
      return;
    }
    if (k == 6) {
      (J->fold).ins.field_0.ot = 0x5689;
      (J->fold).ins.field_0.op1 = IVar1;
      (J->fold).ins.field_0.op2 = IVar2;
      fmt._4_4_ = lj_opt_fold(J);
    }
    else if ((k & 0x10) == 0) {
      fmt._4_4_ = lj_ir_call(J,IRCALL_lj_strfmt_putfstr,(ulong)fmt._4_4_,(ulong)TVar3,
                             (ulong)local_134);
    }
    else {
      fmt._4_4_ = lj_ir_call(J,IRCALL_lj_strfmt_putquoted,(ulong)fmt._4_4_,(ulong)local_134);
    }
    goto LAB_001ac604;
  case 7:
    goto switchD_001ac6b5_caseD_7;
  }
  if ((local_134 >> 0x18 & 0x1f) - 0xf < 5) {
    if (k == 3) {
      (J->fold).ins.field_0.ot = 0x5d04;
      (J->fold).ins.field_0.op1 = IVar2;
      (J->fold).ins.field_0.op2 = 0;
      TVar3 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x5689;
      (J->fold).ins.field_0.op1 = IVar1;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
      fmt._4_4_ = lj_opt_fold(J);
    }
    else {
      (J->fold).ins.field_0.ot = 0x5b16;
      (J->fold).ins.field_0.op1 = IVar2;
      (J->fold).ins.field_0.op2 = 0xad3;
      TVar4 = lj_opt_fold(J);
      fmt._4_4_ = lj_ir_call(J,IRCALL_lj_strfmt_putfxint,(ulong)fmt._4_4_,(ulong)TVar3,(ulong)TVar4)
      ;
    }
  }
  else if ((local_134 & 0x1f000000) == 0xa000000) {
    TVar4 = lj_crecord_loadiu64(J,local_134,rd->argv + _trfmt);
    fmt._4_4_ = lj_ir_call(J,IRCALL_lj_strfmt_putfxint,(ulong)fmt._4_4_,(ulong)TVar3,(ulong)TVar4);
  }
  else {
LAB_001ac9a0:
    TVar4 = lj_ir_tonum(J,local_134);
    fmt._4_4_ = lj_ir_call(J,local_120,(ulong)fmt._4_4_,(ulong)TVar3,(ulong)TVar4);
  }
  goto LAB_001ac604;
switchD_001ac6b5_caseD_7:
  TVar4 = lj_opt_narrow_toint(J,local_134);
  if (k == 7) {
    (J->fold).ins.field_0.ot = 0x5d04;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
    (J->fold).ins.field_0.op2 = 2;
    TVar3 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x5689;
    (J->fold).ins.field_0.op1 = IVar1;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
    fmt._4_4_ = lj_opt_fold(J);
  }
  else {
    fmt._4_4_ = lj_ir_call(J,IRCALL_lj_strfmt_putfchar,(ulong)fmt._4_4_,(ulong)TVar3,(ulong)TVar4);
  }
  goto LAB_001ac604;
}

Assistant:

static void recff_format(jit_State *J, RecordFFData *rd, TRef hdr, int sbufx)
{
  ptrdiff_t arg = sbufx;
  TRef tr = hdr, trfmt = lj_ir_tostr(J, J->base[arg]);
  GCstr *fmt = argv2str(J, &rd->argv[arg]);
  FormatState fs;
  SFormat sf;
  /* Specialize to the format string. */
  emitir(IRTG(IR_EQ, IRT_STR), trfmt, lj_ir_kstr(J, fmt));
  lj_strfmt_init(&fs, strdata(fmt), fmt->len);
  while ((sf = lj_strfmt_parse(&fs)) != STRFMT_EOF) {  /* Parse format. */
    TRef tra = sf == STRFMT_LIT ? 0 : J->base[++arg];
    TRef trsf = lj_ir_kint(J, (int32_t)sf);
    IRCallID id;
    switch (STRFMT_TYPE(sf)) {
    case STRFMT_LIT:
      tr = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr,
		  lj_ir_kstr(J, lj_str_new(J->L, fs.str, fs.len)));
      break;
    case STRFMT_INT:
      id = IRCALL_lj_strfmt_putfnum_int;
    handle_int:
      if (!tref_isinteger(tra)) {
#if LJ_HASFFI
	if (tref_iscdata(tra)) {
	  tra = lj_crecord_loadiu64(J, tra, &rd->argv[arg]);
	  tr = lj_ir_call(J, IRCALL_lj_strfmt_putfxint, tr, trsf, tra);
	  break;
	}
#endif
	goto handle_num;
      }
      if (sf == STRFMT_INT) { /* Shortcut for plain %d. */
	tr = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr,
		    emitir(IRT(IR_TOSTR, IRT_STR), tra, IRTOSTR_INT));
      } else {
#if LJ_HASFFI
	tra = emitir(IRT(IR_CONV, IRT_U64), tra,
		     (IRT_INT|(IRT_U64<<5)|IRCONV_SEXT));
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putfxint, tr, trsf, tra);
	lj_needsplit(J);
#else
	recff_nyiu(J, rd);  /* Don't bother working around this NYI. */
	return;
#endif
      }
      break;
    case STRFMT_UINT:
      id = IRCALL_lj_strfmt_putfnum_uint;
      goto handle_int;
    case STRFMT_NUM:
      id = IRCALL_lj_strfmt_putfnum;
    handle_num:
      tra = lj_ir_tonum(J, tra);
      tr = lj_ir_call(J, id, tr, trsf, tra);
      if (LJ_SOFTFP32) lj_needsplit(J);
      break;
    case STRFMT_STR:
      if (!tref_isstr(tra)) {
	recff_nyiu(J, rd);  /* NYI: __tostring and non-string types for %s. */
	/* NYI: also buffers. */
	return;
      }
      if (sf == STRFMT_STR)  /* Shortcut for plain %s. */
	tr = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr, tra);
      else if ((sf & STRFMT_T_QUOTED))
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putquoted, tr, tra);
      else
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putfstr, tr, trsf, tra);
      break;
    case STRFMT_CHAR:
      tra = lj_opt_narrow_toint(J, tra);
      if (sf == STRFMT_CHAR)  /* Shortcut for plain %c. */
	tr = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr,
		    emitir(IRT(IR_TOSTR, IRT_STR), tra, IRTOSTR_CHAR));
      else
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putfchar, tr, trsf, tra);
      break;
    case STRFMT_PTR:  /* NYI */
    case STRFMT_ERR:
    default:
      recff_nyiu(J, rd);
      return;
    }
  }
  if (sbufx) {
    emitir(IRT(IR_USE, IRT_NIL), tr, 0);
  } else {
    J->base[0] = emitir(IRTG(IR_BUFSTR, IRT_STR), tr, hdr);
  }
}